

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawColumnRt1ShadedPalCommand::Execute
          (DrawColumnRt1ShadedPalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  byte *pbVar11;
  int iVar12;
  
  iVar2 = (this->super_PalRtCommand).yl;
  iVar7 = ((this->super_PalRtCommand).yh - iVar2) + 1;
  iVar12 = thread->pass_end_y - iVar2;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar7 < iVar12) {
    iVar12 = iVar7;
  }
  uVar8 = thread->pass_start_y - iVar2;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar7 = thread->num_cores;
  iVar9 = (iVar7 - (int)((iVar2 + uVar8) - thread->core) % iVar7) % iVar7;
  iVar12 = (int)((~uVar8 + iVar7 + iVar12) - iVar9) / iVar7;
  if (0 < iVar12) {
    iVar3 = (this->super_PalRtCommand)._color;
    puVar5 = (this->super_PalRtCommand)._colormap;
    iVar9 = iVar2 + uVar8 + iVar9;
    pbVar11 = (this->super_PalRtCommand)._destorg +
              (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar9];
    iVar2 = *(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc;
    puVar6 = thread->dc_temp;
    iVar4 = (this->super_PalRtCommand)._pitch;
    lVar10 = 0;
    do {
      bVar1 = puVar5[puVar6[lVar10 * 4 + (long)((iVar9 / iVar7) * 4 + iVar2)]];
      uVar8 = Col2RGB8[0x40 - bVar1][*pbVar11] + Col2RGB8[bVar1][iVar3] | 0x1f07c1f;
      *pbVar11 = RGB32k.All[uVar8 >> 0xf & uVar8];
      pbVar11 = pbVar11 + (long)iVar4 * (long)iVar7;
      lVar10 = lVar10 + 1;
    } while (iVar12 != (int)lVar10);
  }
  return;
}

Assistant:

void DrawColumnRt1ShadedPalCommand::Execute(DrawerThread *thread)
	{
		uint32_t *fgstart;
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		fgstart = &Col2RGB8[0][_color];
		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;

		do {
			uint32_t val = colormap[*source];
			uint32_t fg = fgstart[val<<8];
			val = (Col2RGB8[64-val][*dest] + fg) | 0x1f07c1f;
			*dest = RGB32k.All[val & (val>>15)];
			source += 4;
			dest += pitch;
		} while (--count);
	}